

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_lifo.h
# Opt level: O2

void * lf_lifo_pop(lf_lifo *head)

{
  void *pvVar1;
  void *pvVar2;
  void *__e;
  ulong *puVar3;
  
  do {
    pvVar1 = head->next;
    puVar3 = (ulong *)((ulong)pvVar1 & 0xffffffffffff0000);
    if (puVar3 == (ulong *)0x0) {
      return (void *)0x0;
    }
    LOCK();
    pvVar2 = head->next;
    if (pvVar1 == pvVar2) {
      head->next = (void *)((ulong)pvVar1 & 0xffff | *puVar3 & 0xffffffffffff0000);
      pvVar2 = pvVar1;
    }
    UNLOCK();
  } while (pvVar1 != pvVar2);
  return puVar3;
}

Assistant:

static inline void *
lf_lifo_pop(struct lf_lifo *head)
{
	do {
		void *tail = head->next;
		struct lf_lifo *elem = lf_lifo(tail);
		if (elem == NULL)
			return NULL;
		/*
		 * Discard the old tail's aba value, then save
		 * the old head's value in the tail.
		 * This way head's aba value grows monotonically
		 * regardless of the exact sequence of push/pop
		 * operations.
		 */
		void *newhead;
		void *next = lf_lifo(elem->next);
		if (next != NULL)
			newhead = (char *)next + aba_value(tail);
		else
			newhead = (void *)aba_value(tail);
		if (pm_atomic_compare_exchange_weak(&head->next, &tail, newhead))
			return elem;
	} while (true);
}